

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O1

void __thiscall
validation_block_tests::processnewblock_signals_ordering::test_method
          (processnewblock_signals_ordering *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  long lVar1;
  ChainstateManager *this_00;
  pointer ppCVar2;
  uint256 *puVar3;
  ValidationSignals *pVVar4;
  __pthread_internal_list *p_Var5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  pointer psVar8;
  pointer psVar9;
  pointer psVar10;
  pointer psVar11;
  base_blob<256U> *pbVar12;
  pointer ptVar13;
  pointer psVar14;
  pointer psVar15;
  bool bVar16;
  CChainParams *pCVar17;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar18;
  Chainstate *pCVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  ulong uVar21;
  anon_class_16_2_194bda31_for__M_head_impl *paVar22;
  pointer ptVar23;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_class_16_2_194bda31_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_194bda31_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_194bda31_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_194bda31_for__M_head_impl *paVar24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_03;
  thread *t;
  CBlockIndex *pCVar25;
  pointer ptVar26;
  iterator pvVar27;
  iterator pvVar28;
  ulong uVar29;
  ulong __n;
  int iVar30;
  long in_FS_OFFSET;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  const_string file;
  shared_ptr<CValidationInterface> callbacks;
  shared_ptr<CValidationInterface> callbacks_00;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar33;
  undefined1 local_1a8 [16];
  undefined1 *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  element_type local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  element_type local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  bool ignored;
  vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_> blocks;
  undefined8 local_e0;
  assertion_result local_d8;
  undefined8 *local_c0;
  _Atomic_word *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_98;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  __pthread_internal_list local_78;
  __pthread_internal_list local_68;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  blocks.
  super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blocks.
  super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blocks.
  super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar8 = blocks.
           super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar9 = blocks.
           super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar10 = blocks.
            super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  psVar11 = blocks.
            super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    for (; psVar15 = blocks.
                     super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
        psVar14 = blocks.
                  super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        blocks.
        super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
        ._M_impl.super__Vector_impl_data._M_start = psVar9,
        blocks.
        super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar8; psVar8 = psVar8 + 1) {
      p_Var20 = (psVar8->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      blocks.
      super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar11;
      if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
      }
      psVar9 = blocks.
               super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar10 = psVar14;
      psVar11 = blocks.
                super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      blocks.
      super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar15;
      blocks.
      super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar14;
    }
    blocks.
    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar10;
    pCVar17 = Params();
    CBlockHeader::GetHash((uint256 *)&criticalblock13,&(pCVar17->genesis).super_CBlockHeader);
    pvVar27 = (iterator)0xa;
    pvVar28 = (iterator)0x1f4;
    MinerTestingSetup::BuildChain
              (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(uint256 *)&criticalblock13,100,0xf,10,500,
               &blocks);
    psVar8 = blocks.
             super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar9 = blocks.
             super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar10 = blocks.
              super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar11 = blocks.
              super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  } while ((ulong)((long)blocks.
                         super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)blocks.
                        super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) < 800);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xa2;
  file.m_begin = (iterator)&local_110;
  msg.m_end = pvVar28;
  msg.m_begin = pvVar27;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_120,msg);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman;
  puVar18 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
                       ,0xa2,"test_method","m_node.chainman");
  this_00 = (puVar18->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  pCVar17 = Params();
  local_78.__prev = (__pthread_internal_list *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CBlock,std::allocator<CBlock>,CBlock_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.__next,(CBlock **)&local_78,
             (allocator<CBlock> *)&criticalblock13,&pCVar17->genesis);
  local_1a8._0_8_ = local_78.__prev;
  local_1a8._8_8_ = local_78.__next;
  local_78.__prev = (__pthread_internal_list *)0x0;
  local_78.__next = (__pthread_internal_list *)0x0;
  _cVar33 = 0x762399;
  bVar16 = ChainstateManager::ProcessNewBlock
                     (this_00,(shared_ptr<const_CBlock> *)local_1a8,true,true,&ignored);
  local_d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar16;
  local_d8.m_message.px = (element_type *)0x0;
  local_d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 162, __func__, \"m_node.chainman\")->ProcessNewBlock(std::make_shared<CBlock>(Params().GenesisBlock()), true, true, &ignored)"
  ;
  local_98.px = (element_type *)0xfa1539;
  criticalblock13.super_unique_lock._8_8_ =
       criticalblock13.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock13.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3df0;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_128 = "";
  pvVar27 = (iterator)0x1;
  pvVar28 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d8,(lazy_ostream *)&criticalblock13,1,0,WARN,_cVar33,(size_t)&local_130,0xa2);
  boost::detail::shared_count::~shared_count(&local_d8.m_message.pn);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.__next !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.__next);
  }
  ValidationSignals::SyncWithValidationInterfaceQueue
            ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.validation_signals._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
  criticalblock13.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock13.super_unique_lock._8_8_ =
       criticalblock13.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock13.super_unique_lock);
  pCVar19 = ChainstateManager::ActiveChainstate
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar19->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar19->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar25 = (CBlockIndex *)0x0;
  }
  else {
    pCVar25 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock13.super_unique_lock);
  puVar3 = pCVar25->phashBlock;
  if (puVar3 != (uint256 *)0x0) {
    criticalblock13.super_unique_lock._M_device =
         *(mutex_type **)(puVar3->super_base_blob<256U>).m_data._M_elems;
    pbVar12 = &puVar3->super_base_blob<256U>;
    criticalblock13.super_unique_lock._M_owns = (bool)(pbVar12->m_data)._M_elems[8];
    criticalblock13.super_unique_lock._9_1_ = (pbVar12->m_data)._M_elems[9];
    criticalblock13.super_unique_lock._10_1_ = (pbVar12->m_data)._M_elems[10];
    criticalblock13.super_unique_lock._11_1_ = (pbVar12->m_data)._M_elems[0xb];
    criticalblock13.super_unique_lock._12_1_ = (pbVar12->m_data)._M_elems[0xc];
    criticalblock13.super_unique_lock._13_1_ = (pbVar12->m_data)._M_elems[0xd];
    criticalblock13.super_unique_lock._14_1_ = (pbVar12->m_data)._M_elems[0xe];
    criticalblock13.super_unique_lock._15_1_ = (pbVar12->m_data)._M_elems[0xf];
    uVar6 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
    pp_Var7 = *(_func_int ***)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
    p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    p_Var20->_M_use_count = 1;
    p_Var20->_M_weak_count = 1;
    p_Var20->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_013d9560;
    *(mutex_type **)&p_Var20[1]._M_use_count = criticalblock13.super_unique_lock._M_device;
    p_Var20[2]._vptr__Sp_counted_base = (_func_int **)criticalblock13.super_unique_lock._8_8_;
    p_Var20[2]._M_use_count = (int)uVar6;
    p_Var20[2]._M_weak_count = (int)((ulong)uVar6 >> 0x20);
    p_Var20[3]._vptr__Sp_counted_base = pp_Var7;
    p_Var20[1]._vptr__Sp_counted_base = (_func_int **)&PTR_UpdatedBlockTip_013d95b0;
    pVVar4 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.validation_signals._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var20->_M_use_count = 2;
    }
    callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_140;
    local_140._vptr_CValidationInterface = (_func_int **)(p_Var20 + 1);
    local_138 = p_Var20;
    ValidationSignals::RegisterSharedValidationInterface(pVVar4,callbacks);
    if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
    }
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,10);
    iVar30 = 0;
    paVar24 = extraout_RDX_00;
    do {
      criticalblock13.super_unique_lock._M_device = (mutex_type *)&blocks;
      ptVar26 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
      criticalblock13.super_unique_lock._8_8_ = this;
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ptVar13 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00762bb6;
          std::__throw_length_error("vector::_M_realloc_insert");
          goto LAB_007629d2;
        }
        uVar29 = (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3;
        uVar21 = uVar29 + (uVar29 == 0);
        __n = uVar21 + uVar29;
        if (0xffffffffffffffe < __n) {
          __n = 0xfffffffffffffff;
        }
        if (CARRY8(uVar21,uVar29)) {
          __n = 0xfffffffffffffff;
        }
        if (__n == 0) {
          paVar22 = (anon_class_16_2_194bda31_for__M_head_impl *)0x0;
        }
        else {
          paVar22 = (anon_class_16_2_194bda31_for__M_head_impl *)
                    __gnu_cxx::new_allocator<std::thread>::allocate
                              ((new_allocator<std::thread> *)&threads,__n,(void *)0x0);
          paVar24 = extraout_RDX_02;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,validation_block_tests::processnewblock_signals_ordering::test_method()::__0>
                  ((allocator_type *)((id *)&paVar22->blocks + uVar29),(thread *)&criticalblock13,
                   paVar24);
        paVar24 = paVar22;
        for (ptVar23 = ptVar13; ptVar23 != ptVar26; ptVar23 = ptVar23 + 1) {
          ((id *)&paVar24->blocks)->_M_thread = 0;
          ((id *)&paVar24->blocks)->_M_thread = (ptVar23->_M_id)._M_thread;
          (ptVar23->_M_id)._M_thread = 0;
          paVar24 = (anon_class_16_2_194bda31_for__M_head_impl *)&paVar24->this;
        }
        if (ptVar13 != (pointer)0x0) {
          operator_delete(ptVar13,(long)threads.
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)ptVar13);
        }
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&paVar24->this;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar22;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)((id *)&paVar22->blocks + __n);
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,validation_block_tests::processnewblock_signals_ordering::test_method()::__0>
                  ((allocator_type *)
                   threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)&criticalblock13,paVar24);
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        paVar22 = extraout_RDX_01;
      }
      iVar30 = iVar30 + 1;
      paVar24 = paVar22;
    } while (iVar30 != 10);
    ptVar13 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ptVar26 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_start; ptVar26 != ptVar13; ptVar26 = ptVar26 + 1) {
      std::thread::join();
    }
    ValidationSignals::SyncWithValidationInterfaceQueue
              ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
               super_ChainTestingSetup.super_BasicTestingSetup.m_node.validation_signals._M_t.
               super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
               _M_t.
               super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
               super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
    pVVar4 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.validation_signals._M_t.
             super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
             super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
             super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
    }
    callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX_03._M_pi;
    callbacks_00.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_168;
    local_168._vptr_CValidationInterface = (_func_int **)(p_Var20 + 1);
    local_160 = p_Var20;
    ValidationSignals::UnregisterSharedValidationInterface(pVVar4,callbacks_00);
    if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
    }
    criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock14.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
    local_178 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_170 = "";
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xce;
    file_00.m_begin = (iterator)&local_178;
    msg_00.m_end = pvVar28;
    msg_00.m_begin = pvVar27;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
               msg_00);
    local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
    local_1a8._0_8_ = &PTR__lazy_ostream_013d3cb0;
    local_198 = boost::unit_test::lazy_ostream::inst;
    local_190 = "";
    pCVar19 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    p_Var5 = (__pthread_internal_list *)
             (pCVar19->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (p_Var5 != (__pthread_internal_list *)0x0) {
      local_b8 = &p_Var20[1]._M_use_count;
      local_78 = *p_Var5;
      local_68 = p_Var5[1];
      auVar32[0] = -((char)p_Var20[2]._M_use_count == (char)local_68.__prev);
      auVar32[1] = -(*(char *)((long)&p_Var20[2]._M_use_count + 1) == local_68.__prev._1_1_);
      auVar32[2] = -(*(char *)((long)&p_Var20[2]._M_use_count + 2) == local_68.__prev._2_1_);
      auVar32[3] = -(*(char *)((long)&p_Var20[2]._M_use_count + 3) == local_68.__prev._3_1_);
      auVar32[4] = -((char)p_Var20[2]._M_weak_count == local_68.__prev._4_1_);
      auVar32[5] = -(*(char *)((long)&p_Var20[2]._M_weak_count + 1) == local_68.__prev._5_1_);
      auVar32[6] = -(*(char *)((long)&p_Var20[2]._M_weak_count + 2) == local_68.__prev._6_1_);
      auVar32[7] = -(*(char *)((long)&p_Var20[2]._M_weak_count + 3) == local_68.__prev._7_1_);
      auVar32[8] = -(*(char *)&p_Var20[3]._vptr__Sp_counted_base == (char)local_68.__next);
      auVar32[9] = -(*(char *)((long)&p_Var20[3]._vptr__Sp_counted_base + 1) ==
                    local_68.__next._1_1_);
      auVar32[10] = -(*(char *)((long)&p_Var20[3]._vptr__Sp_counted_base + 2) ==
                     local_68.__next._2_1_);
      auVar32[0xb] = -(*(char *)((long)&p_Var20[3]._vptr__Sp_counted_base + 3) ==
                      local_68.__next._3_1_);
      auVar32[0xc] = -(*(char *)((long)&p_Var20[3]._vptr__Sp_counted_base + 4) ==
                      local_68.__next._4_1_);
      auVar32[0xd] = -(*(char *)((long)&p_Var20[3]._vptr__Sp_counted_base + 5) ==
                      local_68.__next._5_1_);
      auVar32[0xe] = -(*(char *)((long)&p_Var20[3]._vptr__Sp_counted_base + 6) ==
                      local_68.__next._6_1_);
      auVar32[0xf] = -(*(char *)((long)&p_Var20[3]._vptr__Sp_counted_base + 7) ==
                      local_68.__next._7_1_);
      auVar31[0] = -((uchar)p_Var20[1]._M_use_count ==
                    (((base_blob<256U> *)&p_Var5->__prev)->m_data)._M_elems[0]);
      auVar31[1] = -(*(uchar *)((long)&p_Var20[1]._M_use_count + 1) ==
                    (((base_blob<256U> *)&p_Var5->__prev)->m_data)._M_elems[1]);
      auVar31[2] = -(*(uchar *)((long)&p_Var20[1]._M_use_count + 2) ==
                    (((base_blob<256U> *)&p_Var5->__prev)->m_data)._M_elems[2]);
      auVar31[3] = -(*(uchar *)((long)&p_Var20[1]._M_use_count + 3) ==
                    (((base_blob<256U> *)&p_Var5->__prev)->m_data)._M_elems[3]);
      auVar31[4] = -((uchar)p_Var20[1]._M_weak_count ==
                    (((base_blob<256U> *)&p_Var5->__prev)->m_data)._M_elems[4]);
      auVar31[5] = -(*(uchar *)((long)&p_Var20[1]._M_weak_count + 1) ==
                    (((base_blob<256U> *)&p_Var5->__prev)->m_data)._M_elems[5]);
      auVar31[6] = -(*(uchar *)((long)&p_Var20[1]._M_weak_count + 2) ==
                    (((base_blob<256U> *)&p_Var5->__prev)->m_data)._M_elems[6]);
      auVar31[7] = -(*(uchar *)((long)&p_Var20[1]._M_weak_count + 3) ==
                    (((base_blob<256U> *)&p_Var5->__prev)->m_data)._M_elems[7]);
      auVar31[8] = -(*(char *)&p_Var20[2]._vptr__Sp_counted_base == *(char *)&p_Var5->__next);
      auVar31[9] = -(*(char *)((long)&p_Var20[2]._vptr__Sp_counted_base + 1) ==
                    *(undefined1 *)((long)&p_Var5->__next + 1));
      auVar31[10] = -(*(char *)((long)&p_Var20[2]._vptr__Sp_counted_base + 2) ==
                     *(undefined1 *)((long)&p_Var5->__next + 2));
      auVar31[0xb] = -(*(char *)((long)&p_Var20[2]._vptr__Sp_counted_base + 3) ==
                      *(undefined1 *)((long)&p_Var5->__next + 3));
      auVar31[0xc] = -(*(char *)((long)&p_Var20[2]._vptr__Sp_counted_base + 4) ==
                      *(undefined1 *)((long)&p_Var5->__next + 4));
      auVar31[0xd] = -(*(char *)((long)&p_Var20[2]._vptr__Sp_counted_base + 5) ==
                      *(undefined1 *)((long)&p_Var5->__next + 5));
      auVar31[0xe] = -(*(char *)((long)&p_Var20[2]._vptr__Sp_counted_base + 6) ==
                      *(undefined1 *)((long)&p_Var5->__next + 6));
      auVar31[0xf] = -(*(char *)((long)&p_Var20[2]._vptr__Sp_counted_base + 7) ==
                      *(undefined1 *)((long)&p_Var5->__next + 7));
      auVar31 = auVar31 & auVar32;
      local_a0 = (char *)CONCAT71(local_a0._1_7_,
                                  (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                                          (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff);
      local_98.px = (element_type *)0x0;
      local_98.pn.pi_ = (sp_counted_base *)0x0;
      local_b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_a8 = "";
      criticalblock13.super_unique_lock._8_8_ =
           criticalblock13.super_unique_lock._8_8_ & 0xffffffffffffff00;
      criticalblock13.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d4988;
      local_c0 = &local_e0;
      local_e0 = &local_78;
      local_d8.m_message.px = (element_type *)(local_d8.m_message._1_8_ << 8);
      local_d8._0_8_ = &PTR__lazy_ostream_013d4988;
      local_d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_a0,(lazy_ostream *)local_1a8,1,2,REQUIRE,0xfa153a,
                 (size_t)&local_b0,0xce,&criticalblock13,
                 "m_node.chainman->ActiveChain().Tip()->GetBlockHash()",&local_d8);
      boost::detail::shared_count::~shared_count(&local_98.pn);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
      std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
      ~vector(&blocks);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_00762bb6:
      __stack_chk_fail();
    }
  }
LAB_007629d2:
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(processnewblock_signals_ordering)
{
    // build a large-ish chain that's likely to have some forks
    std::vector<std::shared_ptr<const CBlock>> blocks;
    while (blocks.size() < 50) {
        blocks.clear();
        BuildChain(Params().GenesisBlock().GetHash(), 100, 15, 10, 500, blocks);
    }

    bool ignored;
    // Connect the genesis block and drain any outstanding events
    BOOST_CHECK(Assert(m_node.chainman)->ProcessNewBlock(std::make_shared<CBlock>(Params().GenesisBlock()), true, true, &ignored));
    m_node.validation_signals->SyncWithValidationInterfaceQueue();

    // subscribe to events (this subscriber will validate event ordering)
    const CBlockIndex* initial_tip = nullptr;
    {
        LOCK(cs_main);
        initial_tip = m_node.chainman->ActiveChain().Tip();
    }
    auto sub = std::make_shared<TestSubscriber>(initial_tip->GetBlockHash());
    m_node.validation_signals->RegisterSharedValidationInterface(sub);

    // create a bunch of threads that repeatedly process a block generated above at random
    // this will create parallelism and randomness inside validation - the ValidationInterface
    // will subscribe to events generated during block validation and assert on ordering invariance
    std::vector<std::thread> threads;
    threads.reserve(10);
    for (int i = 0; i < 10; i++) {
        threads.emplace_back([&]() {
            bool ignored;
            FastRandomContext insecure;
            for (int i = 0; i < 1000; i++) {
                auto block = blocks[insecure.randrange(blocks.size() - 1)];
                Assert(m_node.chainman)->ProcessNewBlock(block, true, true, &ignored);
            }

            // to make sure that eventually we process the full chain - do it here
            for (const auto& block : blocks) {
                if (block->vtx.size() == 1) {
                    bool processed = Assert(m_node.chainman)->ProcessNewBlock(block, true, true, &ignored);
                    assert(processed);
                }
            }
        });
    }

    for (auto& t : threads) {
        t.join();
    }
    m_node.validation_signals->SyncWithValidationInterfaceQueue();

    m_node.validation_signals->UnregisterSharedValidationInterface(sub);

    LOCK(cs_main);
    BOOST_CHECK_EQUAL(sub->m_expected_tip, m_node.chainman->ActiveChain().Tip()->GetBlockHash());
}